

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
__thiscall flatbuffers::FlatBufFile::service(FlatBufFile *this,int i)

{
  FlatBufService *this_00;
  const_reference ppSVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  int i_local;
  FlatBufFile *this_local;
  
  this_00 = (FlatBufService *)operator_new(0x10);
  ppSVar1 = std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::
            operator[]((vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                        *)(*(long *)(CONCAT44(in_register_00000034,i) + 8) + 0x168),(long)in_EDX);
  FlatBufService::FlatBufService(this_00,*ppSVar1);
  std::unique_ptr<grpc_generator::Service_const,std::default_delete<grpc_generator::Service_const>>
  ::unique_ptr<std::default_delete<grpc_generator::Service_const>,void>
            ((unique_ptr<grpc_generator::Service_const,std::default_delete<grpc_generator::Service_const>>
              *)this,(pointer)this_00);
  return (__uniq_ptr_data<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>,_true,_true>
          )(__uniq_ptr_data<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const grpc_generator::Service> service(int i) const {
    return std::unique_ptr<const grpc_generator::Service>(
        new FlatBufService(parser_.services_.vec[i]));
  }